

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

char * ptls_hexdump(char *buf,void *_src,size_t len)

{
  size_t sVar1;
  char *dst;
  
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    buf[sVar1 * 2] = "0123456789abcdef"[*(byte *)((long)_src + sVar1) >> 4];
    buf[sVar1 * 2 + 1] = "0123456789abcdef"[*(byte *)((long)_src + sVar1) & 0xf];
  }
  buf[sVar1 * 2] = '\0';
  return buf;
}

Assistant:

char *ptls_hexdump(char *buf, const void *_src, size_t len)
{
    char *dst = buf;
    const uint8_t *src = _src;
    size_t i;

    for (i = 0; i != len; ++i) {
        *dst++ = "0123456789abcdef"[src[i] >> 4];
        *dst++ = "0123456789abcdef"[src[i] & 0xf];
    }
    *dst++ = '\0';
    return buf;
}